

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURL_conflict ** curl_multi_get_handles(Curl_multi *multi)

{
  CURL_conflict *pCVar1;
  CURL_conflict **ppCVar2;
  uint uVar3;
  Curl_easy **ppCVar4;
  
  ppCVar2 = (CURL_conflict **)(*Curl_cmalloc)((ulong)(multi->num_easy + 1) << 3);
  if (ppCVar2 != (CURL_conflict **)0x0) {
    ppCVar4 = &multi->easyp;
    uVar3 = 0;
    while( true ) {
      pCVar1 = *ppCVar4;
      if (pCVar1 == (CURL_conflict *)0x0) break;
      if (((pCVar1->state).field_0x74e & 0x20) == 0) {
        ppCVar2[uVar3] = pCVar1;
        uVar3 = uVar3 + 1;
      }
      ppCVar4 = &pCVar1->next;
    }
    ppCVar2[uVar3] = (CURL_conflict *)0x0;
  }
  return ppCVar2;
}

Assistant:

struct Curl_easy **curl_multi_get_handles(struct Curl_multi *multi)
{
  struct Curl_easy **a = malloc(sizeof(struct Curl_easy *) *
                                (multi->num_easy + 1));
  if(a) {
    unsigned int i = 0;
    struct Curl_easy *e = multi->easyp;
    while(e) {
      DEBUGASSERT(i < multi->num_easy);
      if(!e->state.internal)
        a[i++] = e;
      e = e->next;
    }
    a[i] = NULL; /* last entry is a NULL */
  }
  return a;
}